

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  int iVar13;
  int iVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  ulong uVar24;
  BVH *pBVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  ulong unaff_R12;
  size_t mask;
  int iVar31;
  ulong *puVar32;
  ulong *puVar33;
  ulong *puVar34;
  ulong uVar35;
  BVH *pBVar36;
  bool bVar37;
  float fVar38;
  uint uVar39;
  float fVar40;
  uint uVar41;
  float fVar42;
  uint uVar43;
  vint4 bi;
  float fVar44;
  uint uVar45;
  float fVar46;
  uint uVar47;
  uint uVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  uint uVar52;
  uint uVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  uint uVar57;
  uint uVar58;
  float fVar59;
  float fVar60;
  vint4 ai;
  float fVar61;
  uint uVar62;
  uint uVar63;
  float fVar64;
  float fVar65;
  uint uVar66;
  float fVar67;
  uint uVar68;
  float fVar69;
  uint uVar70;
  float fVar71;
  vint4 ai_1;
  uint uVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  NodeRef stack [244];
  size_t local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = root.ptr;
  fVar7 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar9 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar10 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar11 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar12 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar13 = (tray->tnear).field_0.i[k];
  iVar14 = (tray->tfar).field_0.i[k];
  puVar33 = local_7d0;
LAB_00282f1f:
  puVar32 = puVar33;
  if (puVar32 != &local_7d8) {
    puVar33 = puVar32 + -1;
    pBVar25 = (BVH *)puVar32[-1];
    do {
      if (((ulong)pBVar25 & 8) == 0) {
        pfVar1 = (float *)((long)&(pBVar25->super_AccelData).bounds.bounds0.upper.field_0 + uVar26);
        fVar38 = (*pfVar1 - fVar7) * fVar10;
        fVar40 = (pfVar1[1] - fVar7) * fVar10;
        fVar42 = (pfVar1[2] - fVar7) * fVar10;
        fVar44 = (pfVar1[3] - fVar7) * fVar10;
        pfVar1 = (float *)((long)&(pBVar25->super_AccelData).bounds.bounds0.upper.field_0 + uVar28);
        fVar46 = (*pfVar1 - fVar8) * fVar11;
        fVar51 = (pfVar1[1] - fVar8) * fVar11;
        fVar56 = (pfVar1[2] - fVar8) * fVar11;
        fVar61 = (pfVar1[3] - fVar8) * fVar11;
        uVar47 = (uint)((int)fVar46 < (int)fVar38) * (int)fVar38 |
                 (uint)((int)fVar46 >= (int)fVar38) * (int)fVar46;
        uVar52 = (uint)((int)fVar51 < (int)fVar40) * (int)fVar40 |
                 (uint)((int)fVar51 >= (int)fVar40) * (int)fVar51;
        uVar57 = (uint)((int)fVar56 < (int)fVar42) * (int)fVar42 |
                 (uint)((int)fVar56 >= (int)fVar42) * (int)fVar56;
        uVar62 = (uint)((int)fVar61 < (int)fVar44) * (int)fVar44 |
                 (uint)((int)fVar61 >= (int)fVar44) * (int)fVar61;
        pfVar1 = (float *)((long)&(pBVar25->super_AccelData).bounds.bounds0.upper.field_0 + uVar29);
        fVar38 = (*pfVar1 - fVar9) * fVar12;
        fVar40 = (pfVar1[1] - fVar9) * fVar12;
        fVar42 = (pfVar1[2] - fVar9) * fVar12;
        fVar44 = (pfVar1[3] - fVar9) * fVar12;
        uVar39 = (uint)((int)fVar38 < iVar13) * iVar13 | (uint)((int)fVar38 >= iVar13) * (int)fVar38
        ;
        uVar41 = (uint)((int)fVar40 < iVar13) * iVar13 | (uint)((int)fVar40 >= iVar13) * (int)fVar40
        ;
        uVar43 = (uint)((int)fVar42 < iVar13) * iVar13 | (uint)((int)fVar42 >= iVar13) * (int)fVar42
        ;
        uVar45 = (uint)((int)fVar44 < iVar13) * iVar13 | (uint)((int)fVar44 >= iVar13) * (int)fVar44
        ;
        pfVar1 = (float *)((long)&(pBVar25->super_AccelData).bounds.bounds0.upper.field_0 +
                          (uVar26 ^ 0x10));
        fVar38 = (*pfVar1 - fVar7) * fVar10;
        fVar40 = (pfVar1[1] - fVar7) * fVar10;
        fVar42 = (pfVar1[2] - fVar7) * fVar10;
        fVar44 = (pfVar1[3] - fVar7) * fVar10;
        pfVar1 = (float *)((long)&(pBVar25->super_AccelData).bounds.bounds0.upper.field_0 +
                          (uVar28 ^ 0x10));
        fVar46 = (*pfVar1 - fVar8) * fVar11;
        fVar51 = (pfVar1[1] - fVar8) * fVar11;
        fVar56 = (pfVar1[2] - fVar8) * fVar11;
        fVar61 = (pfVar1[3] - fVar8) * fVar11;
        uVar66 = (uint)((int)fVar38 < (int)fVar46) * (int)fVar38 |
                 (uint)((int)fVar38 >= (int)fVar46) * (int)fVar46;
        uVar68 = (uint)((int)fVar40 < (int)fVar51) * (int)fVar40 |
                 (uint)((int)fVar40 >= (int)fVar51) * (int)fVar51;
        uVar70 = (uint)((int)fVar42 < (int)fVar56) * (int)fVar42 |
                 (uint)((int)fVar42 >= (int)fVar56) * (int)fVar56;
        uVar72 = (uint)((int)fVar44 < (int)fVar61) * (int)fVar44 |
                 (uint)((int)fVar44 >= (int)fVar61) * (int)fVar61;
        pfVar1 = (float *)((long)&(pBVar25->super_AccelData).bounds.bounds0.upper.field_0 +
                          (uVar29 ^ 0x10));
        fVar38 = (*pfVar1 - fVar9) * fVar12;
        fVar40 = (pfVar1[1] - fVar9) * fVar12;
        fVar42 = (pfVar1[2] - fVar9) * fVar12;
        fVar44 = (pfVar1[3] - fVar9) * fVar12;
        uVar48 = (uint)(iVar14 < (int)fVar38) * iVar14 | (uint)(iVar14 >= (int)fVar38) * (int)fVar38
        ;
        uVar53 = (uint)(iVar14 < (int)fVar40) * iVar14 | (uint)(iVar14 >= (int)fVar40) * (int)fVar40
        ;
        uVar58 = (uint)(iVar14 < (int)fVar42) * iVar14 | (uint)(iVar14 >= (int)fVar42) * (int)fVar42
        ;
        uVar63 = (uint)(iVar14 < (int)fVar44) * iVar14 | (uint)(iVar14 >= (int)fVar44) * (int)fVar44
        ;
        auVar15._4_4_ =
             -(uint)((int)(((int)uVar68 < (int)uVar53) * uVar68 |
                          ((int)uVar68 >= (int)uVar53) * uVar53) <
                    (int)(((int)uVar41 < (int)uVar52) * uVar52 |
                         ((int)uVar41 >= (int)uVar52) * uVar41));
        auVar15._0_4_ =
             -(uint)((int)(((int)uVar66 < (int)uVar48) * uVar66 |
                          ((int)uVar66 >= (int)uVar48) * uVar48) <
                    (int)(((int)uVar39 < (int)uVar47) * uVar47 |
                         ((int)uVar39 >= (int)uVar47) * uVar39));
        auVar15._8_4_ =
             -(uint)((int)(((int)uVar70 < (int)uVar58) * uVar70 |
                          ((int)uVar70 >= (int)uVar58) * uVar58) <
                    (int)(((int)uVar43 < (int)uVar57) * uVar57 |
                         ((int)uVar43 >= (int)uVar57) * uVar43));
        auVar15._12_4_ =
             -(uint)((int)(((int)uVar72 < (int)uVar63) * uVar72 |
                          ((int)uVar72 >= (int)uVar63) * uVar63) <
                    (int)(((int)uVar45 < (int)uVar62) * uVar62 |
                         ((int)uVar45 >= (int)uVar62) * uVar45));
        uVar39 = movmskps((int)bvh,auVar15);
        bvh = (BVH *)((ulong)uVar39 ^ 0xf);
        unaff_R12 = (ulong)bvh & 0xff;
      }
      if (((ulong)pBVar25 & 8) == 0) {
        if (unaff_R12 == 0) {
          uVar39 = 4;
        }
        else {
          uVar24 = (ulong)pBVar25 & 0xfffffffffffffff0;
          lVar30 = 0;
          if (unaff_R12 != 0) {
            for (; (unaff_R12 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
            }
          }
          uVar39 = 0;
          pBVar25 = *(BVH **)(uVar24 + lVar30 * 8);
          uVar35 = unaff_R12 - 1 & unaff_R12;
          bvh = pBVar25;
          if (uVar35 != 0) {
            *puVar33 = (ulong)pBVar25;
            lVar30 = 0;
            if (uVar35 != 0) {
              for (; (uVar35 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
              }
            }
            uVar27 = uVar35 - 1;
            while( true ) {
              puVar33 = puVar33 + 1;
              pBVar25 = *(BVH **)(uVar24 + lVar30 * 8);
              uVar27 = uVar27 & uVar35;
              if (uVar27 == 0) break;
              *puVar33 = (ulong)pBVar25;
              lVar30 = 0;
              if (uVar27 != 0) {
                for (; (uVar27 >> lVar30 & 1) == 0; lVar30 = lVar30 + 1) {
                }
              }
              uVar35 = uVar27 - 1;
            }
            bvh = (BVH *)0x0;
          }
        }
      }
      else {
        uVar39 = 6;
      }
    } while (uVar39 == 0);
    if (uVar39 == 6) {
      uVar24 = (ulong)((uint)pBVar25 & 0xf);
      uVar39 = 0;
      pBVar36 = (BVH *)(uVar24 - 8);
      bVar37 = uVar24 != 8;
      if (bVar37) {
        uVar24 = (ulong)pBVar25 & 0xfffffffffffffff0;
        fVar38 = *(float *)(ray + k * 4);
        fVar40 = *(float *)(ray + k * 4 + 0x10);
        fVar42 = *(float *)(ray + k * 4 + 0x20);
        fVar44 = *(float *)(ray + k * 4 + 0x40);
        fVar46 = *(float *)(ray + k * 4 + 0x50);
        fVar51 = *(float *)(ray + k * 4 + 0x60);
        bvh = (BVH *)0x0;
        puVar34 = puVar33;
        do {
          lVar30 = (long)bvh * 0xe0;
          pfVar1 = (float *)(uVar24 + lVar30);
          fVar56 = *pfVar1;
          fVar61 = pfVar1[1];
          fVar94 = pfVar1[2];
          fVar95 = pfVar1[3];
          pfVar1 = (float *)(uVar24 + 0x10 + lVar30);
          fVar82 = *pfVar1;
          fVar84 = pfVar1[1];
          fVar86 = pfVar1[2];
          fVar88 = pfVar1[3];
          pfVar1 = (float *)(uVar24 + 0x20 + lVar30);
          fVar90 = *pfVar1;
          fVar91 = pfVar1[1];
          fVar92 = pfVar1[2];
          fVar93 = pfVar1[3];
          pfVar1 = (float *)(uVar24 + 0x40 + lVar30);
          fVar49 = fVar82 - *pfVar1;
          fVar54 = fVar84 - pfVar1[1];
          fVar59 = fVar86 - pfVar1[2];
          fVar64 = fVar88 - pfVar1[3];
          pfVar2 = (float *)(uVar24 + 0x50 + lVar30);
          fVar74 = fVar90 - *pfVar2;
          fVar75 = fVar91 - pfVar2[1];
          fVar76 = fVar92 - pfVar2[2];
          fVar77 = fVar93 - pfVar2[3];
          pfVar4 = (float *)(uVar24 + 0x90 + lVar30);
          fVar100 = *pfVar4 - fVar56;
          fVar101 = pfVar4[1] - fVar61;
          fVar102 = pfVar4[2] - fVar94;
          fVar103 = pfVar4[3] - fVar95;
          pfVar5 = (float *)(uVar24 + 0xa0 + lVar30);
          fVar104 = *pfVar5 - fVar82;
          fVar105 = pfVar5[1] - fVar84;
          fVar106 = pfVar5[2] - fVar86;
          fVar107 = pfVar5[3] - fVar88;
          pfVar6 = (float *)(uVar24 + 0xb0 + lVar30);
          fVar108 = *pfVar6 - fVar90;
          fVar109 = pfVar6[1] - fVar91;
          fVar110 = pfVar6[2] - fVar92;
          fVar111 = pfVar6[3] - fVar93;
          fVar116 = fVar74 * fVar104 - fVar49 * fVar108;
          fVar118 = fVar75 * fVar105 - fVar54 * fVar109;
          fVar120 = fVar76 * fVar106 - fVar59 * fVar110;
          fVar122 = fVar77 * fVar107 - fVar64 * fVar111;
          fVar78 = fVar56 - fVar38;
          fVar79 = fVar61 - fVar38;
          fVar80 = fVar94 - fVar38;
          fVar81 = fVar95 - fVar38;
          fVar82 = fVar82 - fVar40;
          fVar84 = fVar84 - fVar40;
          fVar86 = fVar86 - fVar40;
          fVar88 = fVar88 - fVar40;
          fVar112 = fVar78 * fVar46 - fVar82 * fVar44;
          fVar113 = fVar79 * fVar46 - fVar84 * fVar44;
          fVar114 = fVar80 * fVar46 - fVar86 * fVar44;
          fVar115 = fVar81 * fVar46 - fVar88 * fVar44;
          pfVar3 = (float *)(uVar24 + 0x30 + lVar30);
          fVar56 = fVar56 - *pfVar3;
          fVar61 = fVar61 - pfVar3[1];
          fVar94 = fVar94 - pfVar3[2];
          fVar95 = fVar95 - pfVar3[3];
          fVar96 = fVar56 * fVar108 - fVar74 * fVar100;
          fVar97 = fVar61 * fVar109 - fVar75 * fVar101;
          fVar98 = fVar94 * fVar110 - fVar76 * fVar102;
          fVar99 = fVar95 * fVar111 - fVar77 * fVar103;
          fVar90 = fVar90 - fVar42;
          fVar91 = fVar91 - fVar42;
          fVar92 = fVar92 - fVar42;
          fVar93 = fVar93 - fVar42;
          fVar67 = fVar90 * fVar44 - fVar78 * fVar51;
          fVar69 = fVar91 * fVar44 - fVar79 * fVar51;
          fVar71 = fVar92 * fVar44 - fVar80 * fVar51;
          fVar73 = fVar93 * fVar44 - fVar81 * fVar51;
          fVar50 = fVar49 * fVar100 - fVar56 * fVar104;
          fVar55 = fVar54 * fVar101 - fVar61 * fVar105;
          fVar60 = fVar59 * fVar102 - fVar94 * fVar106;
          fVar65 = fVar64 * fVar103 - fVar95 * fVar107;
          fVar83 = fVar82 * fVar51 - fVar90 * fVar46;
          fVar85 = fVar84 * fVar51 - fVar91 * fVar46;
          fVar87 = fVar86 * fVar51 - fVar92 * fVar46;
          fVar89 = fVar88 * fVar51 - fVar93 * fVar46;
          fVar117 = fVar116 * fVar44 + fVar96 * fVar46 + fVar50 * fVar51;
          fVar119 = fVar118 * fVar44 + fVar97 * fVar46 + fVar55 * fVar51;
          fVar121 = fVar120 * fVar44 + fVar98 * fVar46 + fVar60 * fVar51;
          fVar123 = fVar122 * fVar44 + fVar99 * fVar46 + fVar65 * fVar51;
          uVar41 = (uint)fVar117 & 0x80000000;
          uVar43 = (uint)fVar119 & 0x80000000;
          uVar45 = (uint)fVar121 & 0x80000000;
          uVar47 = (uint)fVar123 & 0x80000000;
          fVar100 = (float)((uint)(fVar100 * fVar83 + fVar104 * fVar67 + fVar108 * fVar112) ^ uVar41
                           );
          fVar101 = (float)((uint)(fVar101 * fVar85 + fVar105 * fVar69 + fVar109 * fVar113) ^ uVar43
                           );
          fVar102 = (float)((uint)(fVar102 * fVar87 + fVar106 * fVar71 + fVar110 * fVar114) ^ uVar45
                           );
          fVar103 = (float)((uint)(fVar103 * fVar89 + fVar107 * fVar73 + fVar111 * fVar115) ^ uVar47
                           );
          fVar49 = (float)((uint)(fVar83 * fVar56 + fVar67 * fVar49 + fVar112 * fVar74) ^ uVar41);
          fVar54 = (float)((uint)(fVar85 * fVar61 + fVar69 * fVar54 + fVar113 * fVar75) ^ uVar43);
          fVar59 = (float)((uint)(fVar87 * fVar94 + fVar71 * fVar59 + fVar114 * fVar76) ^ uVar45);
          fVar64 = (float)((uint)(fVar89 * fVar95 + fVar73 * fVar64 + fVar115 * fVar77) ^ uVar47);
          fVar56 = ABS(fVar117);
          fVar61 = ABS(fVar119);
          fVar94 = ABS(fVar121);
          fVar95 = ABS(fVar123);
          bVar20 = ((0.0 <= fVar49 && 0.0 <= fVar100) && fVar117 != 0.0) &&
                   fVar100 + fVar49 <= fVar56;
          bVar21 = ((0.0 <= fVar54 && 0.0 <= fVar101) && fVar119 != 0.0) &&
                   fVar101 + fVar54 <= fVar61;
          bVar22 = ((0.0 <= fVar59 && 0.0 <= fVar102) && fVar121 != 0.0) &&
                   fVar102 + fVar59 <= fVar94;
          bVar23 = ((0.0 <= fVar64 && 0.0 <= fVar103) && fVar123 != 0.0) &&
                   fVar103 + fVar64 <= fVar95;
          lVar30 = lVar30 + uVar24;
          auVar19._4_4_ = -(uint)bVar21;
          auVar19._0_4_ = -(uint)bVar20;
          auVar19._8_4_ = -(uint)bVar22;
          auVar19._12_4_ = -(uint)bVar23;
          iVar31 = movmskps((int)puVar34,auVar19);
          if (iVar31 != 0) {
            fVar90 = (float)(uVar41 ^ (uint)(fVar116 * fVar78 + fVar96 * fVar82 + fVar50 * fVar90));
            fVar91 = (float)(uVar43 ^ (uint)(fVar118 * fVar79 + fVar97 * fVar84 + fVar55 * fVar91));
            fVar86 = (float)(uVar45 ^ (uint)(fVar120 * fVar80 + fVar98 * fVar86 + fVar60 * fVar92));
            fVar88 = (float)(uVar47 ^ (uint)(fVar122 * fVar81 + fVar99 * fVar88 + fVar65 * fVar93));
            fVar82 = *(float *)(ray + k * 4 + 0x30);
            fVar84 = *(float *)(ray + k * 4 + 0x80);
            auVar16._4_4_ =
                 -(uint)((fVar91 <= fVar84 * fVar61 && fVar82 * fVar61 < fVar91) && bVar21);
            auVar16._0_4_ =
                 -(uint)((fVar90 <= fVar84 * fVar56 && fVar82 * fVar56 < fVar90) && bVar20);
            auVar16._8_4_ =
                 -(uint)((fVar86 <= fVar84 * fVar94 && fVar82 * fVar94 < fVar86) && bVar22);
            auVar16._12_4_ =
                 -(uint)((fVar88 <= fVar84 * fVar95 && fVar82 * fVar95 < fVar88) && bVar23);
            iVar31 = movmskps((int)ray,auVar16);
            if (iVar31 != 0) {
              uVar35 = (ulong)(byte)iVar31;
              do {
                uVar27 = 0;
                if (uVar35 != 0) {
                  for (; (uVar35 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                  }
                }
                if ((*(uint *)(ray + k * 4 + 0x90) &
                    ((context->scene->geometries).items[*(uint *)(lVar30 + 0xc0 + uVar27 * 4)].ptr)
                    ->mask) != 0) goto LAB_002836e4;
                uVar35 = uVar35 ^ 1L << (uVar27 & 0x3f);
              } while (uVar35 != 0);
              iVar31 = 0;
            }
          }
          fVar56 = *(float *)(lVar30 + 0x60);
          fVar61 = *(float *)(lVar30 + 100);
          fVar94 = *(float *)(lVar30 + 0x68);
          fVar95 = *(float *)(lVar30 + 0x6c);
          fVar82 = *(float *)(lVar30 + 0x70);
          fVar84 = *(float *)(lVar30 + 0x74);
          fVar86 = *(float *)(lVar30 + 0x78);
          fVar88 = *(float *)(lVar30 + 0x7c);
          fVar90 = *(float *)(lVar30 + 0x80);
          fVar91 = *(float *)(lVar30 + 0x84);
          fVar92 = *(float *)(lVar30 + 0x88);
          fVar93 = *(float *)(lVar30 + 0x8c);
          fVar67 = fVar56 - *pfVar4;
          fVar71 = fVar61 - pfVar4[1];
          fVar74 = fVar94 - pfVar4[2];
          fVar76 = fVar95 - pfVar4[3];
          fVar104 = fVar82 - *pfVar5;
          fVar106 = fVar84 - pfVar5[1];
          fVar108 = fVar86 - pfVar5[2];
          fVar110 = fVar88 - pfVar5[3];
          fVar49 = fVar90 - *pfVar6;
          fVar54 = fVar91 - pfVar6[1];
          fVar59 = fVar92 - pfVar6[2];
          fVar64 = fVar93 - pfVar6[3];
          fVar96 = *pfVar3 - fVar56;
          fVar97 = pfVar3[1] - fVar61;
          fVar98 = pfVar3[2] - fVar94;
          fVar99 = pfVar3[3] - fVar95;
          fVar116 = *pfVar1 - fVar82;
          fVar117 = pfVar1[1] - fVar84;
          fVar118 = pfVar1[2] - fVar86;
          fVar119 = pfVar1[3] - fVar88;
          fVar120 = *pfVar2 - fVar90;
          fVar121 = pfVar2[1] - fVar91;
          fVar122 = pfVar2[2] - fVar92;
          fVar123 = pfVar2[3] - fVar93;
          fVar56 = fVar56 - fVar38;
          fVar61 = fVar61 - fVar38;
          fVar94 = fVar94 - fVar38;
          fVar95 = fVar95 - fVar38;
          fVar90 = fVar90 - fVar42;
          fVar91 = fVar91 - fVar42;
          fVar92 = fVar92 - fVar42;
          fVar93 = fVar93 - fVar42;
          fVar100 = fVar44 * fVar90 - fVar51 * fVar56;
          fVar101 = fVar44 * fVar91 - fVar51 * fVar61;
          fVar102 = fVar44 * fVar92 - fVar51 * fVar94;
          fVar103 = fVar44 * fVar93 - fVar51 * fVar95;
          fVar50 = fVar116 * fVar49 - fVar104 * fVar120;
          fVar55 = fVar117 * fVar54 - fVar106 * fVar121;
          fVar60 = fVar118 * fVar59 - fVar108 * fVar122;
          fVar65 = fVar119 * fVar64 - fVar110 * fVar123;
          fVar82 = fVar82 - fVar40;
          fVar84 = fVar84 - fVar40;
          fVar86 = fVar86 - fVar40;
          fVar88 = fVar88 - fVar40;
          fVar105 = fVar51 * fVar82 - fVar46 * fVar90;
          fVar107 = fVar51 * fVar84 - fVar46 * fVar91;
          fVar109 = fVar51 * fVar86 - fVar46 * fVar92;
          fVar111 = fVar51 * fVar88 - fVar46 * fVar93;
          fVar69 = fVar67 * fVar120 - fVar96 * fVar49;
          fVar73 = fVar71 * fVar121 - fVar97 * fVar54;
          fVar75 = fVar74 * fVar122 - fVar98 * fVar59;
          fVar77 = fVar76 * fVar123 - fVar99 * fVar64;
          fVar83 = fVar96 * fVar104 - fVar67 * fVar116;
          fVar85 = fVar97 * fVar106 - fVar71 * fVar117;
          fVar87 = fVar98 * fVar108 - fVar74 * fVar118;
          fVar89 = fVar99 * fVar110 - fVar76 * fVar119;
          fVar78 = fVar46 * fVar56 - fVar44 * fVar82;
          fVar79 = fVar46 * fVar61 - fVar44 * fVar84;
          fVar80 = fVar46 * fVar94 - fVar44 * fVar86;
          fVar81 = fVar46 * fVar95 - fVar44 * fVar88;
          fVar112 = fVar44 * fVar50 + fVar46 * fVar69 + fVar51 * fVar83;
          fVar113 = fVar44 * fVar55 + fVar46 * fVar73 + fVar51 * fVar85;
          fVar114 = fVar44 * fVar60 + fVar46 * fVar75 + fVar51 * fVar87;
          fVar115 = fVar44 * fVar65 + fVar46 * fVar77 + fVar51 * fVar89;
          uVar43 = (uint)fVar112 & 0x80000000;
          uVar45 = (uint)fVar113 & 0x80000000;
          uVar47 = (uint)fVar114 & 0x80000000;
          uVar48 = (uint)fVar115 & 0x80000000;
          fVar96 = (float)((uint)(fVar96 * fVar105 + fVar116 * fVar100 + fVar120 * fVar78) ^ uVar43)
          ;
          fVar97 = (float)((uint)(fVar97 * fVar107 + fVar117 * fVar101 + fVar121 * fVar79) ^ uVar45)
          ;
          fVar98 = (float)((uint)(fVar98 * fVar109 + fVar118 * fVar102 + fVar122 * fVar80) ^ uVar47)
          ;
          fVar99 = (float)((uint)(fVar99 * fVar111 + fVar119 * fVar103 + fVar123 * fVar81) ^ uVar48)
          ;
          fVar67 = (float)((uint)(fVar105 * fVar67 + fVar100 * fVar104 + fVar78 * fVar49) ^ uVar43);
          fVar71 = (float)((uint)(fVar107 * fVar71 + fVar101 * fVar106 + fVar79 * fVar54) ^ uVar45);
          fVar74 = (float)((uint)(fVar109 * fVar74 + fVar102 * fVar108 + fVar80 * fVar59) ^ uVar47);
          fVar76 = (float)((uint)(fVar111 * fVar76 + fVar103 * fVar110 + fVar81 * fVar64) ^ uVar48);
          fVar49 = ABS(fVar112);
          fVar54 = ABS(fVar113);
          fVar59 = ABS(fVar114);
          fVar64 = ABS(fVar115);
          bVar20 = ((0.0 <= fVar67 && 0.0 <= fVar96) && fVar112 != 0.0) && fVar96 + fVar67 <= fVar49
          ;
          bVar21 = ((0.0 <= fVar71 && 0.0 <= fVar97) && fVar113 != 0.0) && fVar97 + fVar71 <= fVar54
          ;
          bVar22 = ((0.0 <= fVar74 && 0.0 <= fVar98) && fVar114 != 0.0) && fVar98 + fVar74 <= fVar59
          ;
          bVar23 = ((0.0 <= fVar76 && 0.0 <= fVar99) && fVar115 != 0.0) && fVar99 + fVar76 <= fVar64
          ;
          auVar18._4_4_ = -(uint)bVar21;
          auVar18._0_4_ = -(uint)bVar20;
          auVar18._8_4_ = -(uint)bVar22;
          auVar18._12_4_ = -(uint)bVar23;
          uVar41 = movmskps(iVar31,auVar18);
          puVar34 = (ulong *)(ulong)uVar41;
          if (uVar41 != 0) {
            fVar82 = (float)(uVar43 ^ (uint)(fVar56 * fVar50 + fVar82 * fVar69 + fVar90 * fVar83));
            fVar84 = (float)(uVar45 ^ (uint)(fVar61 * fVar55 + fVar84 * fVar73 + fVar91 * fVar85));
            fVar94 = (float)(uVar47 ^ (uint)(fVar94 * fVar60 + fVar86 * fVar75 + fVar92 * fVar87));
            fVar95 = (float)(uVar48 ^ (uint)(fVar95 * fVar65 + fVar88 * fVar77 + fVar93 * fVar89));
            fVar56 = *(float *)(ray + k * 4 + 0x30);
            fVar61 = *(float *)(ray + k * 4 + 0x80);
            auVar17._4_4_ =
                 -(uint)((fVar84 <= fVar61 * fVar54 && fVar56 * fVar54 < fVar84) && bVar21);
            auVar17._0_4_ =
                 -(uint)((fVar82 <= fVar61 * fVar49 && fVar56 * fVar49 < fVar82) && bVar20);
            auVar17._8_4_ =
                 -(uint)((fVar94 <= fVar61 * fVar59 && fVar56 * fVar59 < fVar94) && bVar22);
            auVar17._12_4_ =
                 -(uint)((fVar95 <= fVar61 * fVar64 && fVar56 * fVar64 < fVar95) && bVar23);
            uVar41 = movmskps((int)ray,auVar17);
            puVar34 = (ulong *)(ulong)uVar41;
            if (uVar41 != 0) {
              uVar35 = (ulong)(byte)uVar41;
              do {
                uVar27 = 0;
                if (uVar35 != 0) {
                  for (; (uVar35 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                  }
                }
                if ((*(uint *)(ray + k * 4 + 0x90) &
                    ((context->scene->geometries).items[*(uint *)(lVar30 + 0xc0 + uVar27 * 4)].ptr)
                    ->mask) != 0) goto LAB_002836e4;
                uVar35 = uVar35 ^ 1L << (uVar27 & 0x3f);
              } while (uVar35 != 0);
              puVar34 = (ulong *)0x0;
            }
          }
          bvh = (BVH *)((long)&(bvh->super_AccelData).super_RefCount._vptr_RefCount + 1);
          bVar37 = bvh < pBVar36;
        } while (bvh != pBVar36);
      }
    }
    goto LAB_002836d8;
  }
  goto LAB_0028373e;
LAB_002836e4:
  if (bVar37) {
    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
    uVar39 = 1;
  }
LAB_002836d8:
  if ((uVar39 & 3) != 0) {
LAB_0028373e:
    return puVar32 != &local_7d8;
  }
  goto LAB_00282f1f;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }